

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseEncoder.cpp
# Opt level: O1

void __thiscall siamese::Encoder::Encoder(Encoder *this)

{
  long lVar1;
  
  pktalloc::Allocator::Allocator(&this->TheAllocator);
  (this->Stats).Counts[0] = 0;
  (this->Stats).Counts[1] = 0;
  (this->Stats).Counts[2] = 0;
  (this->Stats).Counts[3] = 0;
  (this->Stats).Counts[4] = 0;
  (this->Stats).Counts[5] = 0;
  (this->Stats).Counts[6] = 0;
  (this->Stats).Counts[7] = 0;
  (this->Stats).Counts[8] = 0;
  EncoderPacketWindow::EncoderPacketWindow(&this->Window);
  (this->Ack).OldestColumn = 0;
  (this->Ack).RetransmitTimeoutMsec = 500;
  (this->Ack).TheAllocator = (Allocator *)0x0;
  (this->Ack).TheWindow = (EncoderPacketWindow *)0x0;
  (this->Ack).Data = (uint8_t *)0x0;
  (this->Ack).DataBytes = 0;
  (this->Ack).Offset = 0;
  *(undefined8 *)((long)&(this->Ack).Data + 1) = 0;
  *(undefined8 *)((long)&(this->Ack).DataBytes + 1) = 0;
  *(undefined8 *)((long)&(this->Ack).LossColumn + 1) = 0;
  *(undefined8 *)((long)&(this->Ack).NextColumnExpected + 1) = 0;
  lVar1 = 0x6a0;
  do {
    *(undefined4 *)((long)(this->TheAllocator).PreferredWindows.PreallocatedData + lVar1 + -0x10) =
         0;
    *(undefined8 *)((long)(this->TheAllocator).PreferredWindows.PreallocatedData + lVar1 + -8) = 0;
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x6d0);
  (this->RecoveryPacket).Data = (uint8_t *)0x0;
  (this->RecoveryPacket).Bytes = 0;
  this->NextRow = 0;
  this->NextParityColumn = 0;
  this->NextCauchyRow = 0;
  (this->Window).TheAllocator = &this->TheAllocator;
  (this->Window).Stats = &this->Stats;
  (this->Ack).TheAllocator = &this->TheAllocator;
  (this->Ack).TheWindow = &this->Window;
  return;
}

Assistant:

Encoder::Encoder()
{
    Window.TheAllocator = &TheAllocator;
    Window.Stats        = &Stats;
    Ack.TheAllocator    = &TheAllocator;
    Ack.TheWindow       = &Window;
}